

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O1

bool __thiscall OpenGliderConnection::APRSSendKeepAlive(OpenGliderConnection *this)

{
  ssize_t sVar1;
  size_t __n;
  void *__buf;
  int __flags;
  char sKeepAlive [120];
  long *in_stack_ffffffffffffff58;
  long *plVar2;
  long local_98 [2];
  char local_88 [120];
  
  time((time_t *)0x0);
  ts2string_abi_cxx11_((time_t)in_stack_ffffffffffffff58);
  plVar2 = in_stack_ffffffffffffff58;
  snprintf(local_88,0x78,"# LiveTraffic %s still alive at %sZ\r\n");
  __flags = (int)in_stack_ffffffffffffff58;
  if (plVar2 != local_98) {
    operator_delete(plVar2,local_98[0] + 1);
  }
  if ((int)dataRefs.iLogLevel < 1) {
    __flags = 0x276e07;
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
           ,0x218,"APRSSendKeepAlive",logDEBUG,"OGN: Sending keep alive: %s",local_88);
  }
  __n = 1;
  LTOnlineChannel::DebugLogRaw((LTOnlineChannel *)this,local_88,-1,true);
  sVar1 = XPMP2::TCPConnection::send(&this->tcpAprs,(int)local_88,__buf,__n,__flags);
  return SUB81(sVar1,0);
}

Assistant:

bool OpenGliderConnection::APRSSendKeepAlive()
{
    // Prepare login string like "user LiveTrffc pass -1 vers LiveTraffic 2.20 filter r/43.3/-80.2/50 -p/oimqstunw"
    char sKeepAlive[120];
    snprintf(sKeepAlive, sizeof(sKeepAlive), OGN_APRS_KEEP_ALIVE, LT_VERSION,
             ts2string(time(nullptr)).c_str());
    LOG_MSG(logDEBUG, "OGN: Sending keep alive: %s", sKeepAlive);
    DebugLogRaw(sKeepAlive, HTTP_FLAG_SENDING);
    return tcpAprs.send(sKeepAlive);
}